

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O1

bool __thiscall
llbuild::buildsystem::ShellCommand::configureAttribute
          (ShellCommand *this,ConfigureContext *ctx,StringRef name,ArrayRef<llvm::StringRef> values)

{
  pointer *ppSVar1;
  pointer pSVar2;
  iterator __position;
  Child LHS;
  Child CVar3;
  bool bVar4;
  undefined4 extraout_var;
  size_t extraout_RDX;
  StringRef *From;
  size_type __n;
  StringRef *pSVar5;
  Child RHS;
  Child local_88 [2];
  undefined8 local_78;
  undefined4 local_70;
  undefined4 uStack_6c;
  NodeKind local_60;
  char cStack_5f;
  undefined6 uStack_5e;
  undefined4 local_58;
  undefined4 uStack_54;
  NodeKind local_48;
  char cStack_47;
  undefined6 uStack_46;
  StringRef local_40;
  
  __n = values.Length;
  From = values.Data;
  if (name.Length == 4) {
    if (*(int *)name.Data == 0x73677261) {
      if (__n == 0) {
        local_40.Data = (this->super_ExternalCommand).super_Command.name._M_dataplus._M_p;
        local_40.Length = (this->super_ExternalCommand).super_Command.name._M_string_length;
        llvm::Twine::Twine((Twine *)&local_58,"invalid arguments for command \'",&local_40);
        llvm::Twine::Twine((Twine *)&local_70,"\'");
        if ((local_48 == NullKind) || (local_60 == NullKind)) {
          local_78 = CONCAT62(local_78._2_6_,0x100);
        }
        else if (local_48 == EmptyKind) {
          local_78 = CONCAT62(uStack_5e,CONCAT11(cStack_5f,local_60));
        }
        else if (local_60 == EmptyKind) {
          local_78 = CONCAT62(uStack_46,CONCAT11(cStack_47,local_48));
        }
        else {
          LHS._4_4_ = uStack_54;
          LHS.decUI = local_58;
          if (cStack_47 != '\x01') {
            local_48 = TwineKind;
            LHS.twine = (Twine *)&local_58;
          }
          if (cStack_5f != '\x01') {
            local_60 = TwineKind;
          }
          CVar3._4_4_ = uStack_6c;
          CVar3.decUI = local_70;
          RHS.twine = (Twine *)&local_70;
          if (cStack_5f == '\x01') {
            RHS = CVar3;
          }
          llvm::Twine::Twine((Twine *)local_88,LHS,local_48,RHS,local_60);
        }
        ConfigureContext::error(ctx,(Twine *)local_88);
        return false;
      }
      pSVar2 = (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
          .super__Vector_impl_data._M_finish != pSVar2) {
        (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar2;
      }
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::reserve(&this->args,__n);
      pSVar5 = From + __n;
      do {
        local_88[0]._0_4_ =
             (*ctx->delegate->_vptr_BuildFileDelegate[2])(ctx->delegate,From->Data,From->Length);
        local_88[0]._4_4_ = extraout_var;
        __position._M_current =
             (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->args).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::
          _M_realloc_insert<llvm::StringRef>(&this->args,__position,(StringRef *)local_88);
        }
        else {
          (__position._M_current)->Data = (char *)local_88[0];
          (__position._M_current)->Length = extraout_RDX;
          ppSVar1 = &(this->args).
                     super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
        From = From + 1;
      } while (From != pSVar5);
    }
    else {
      if (*(int *)name.Data != 0x73706564) goto LAB_001aed92;
      llvm::
      SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::clear(&(this->depsPaths).
               super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             );
      llvm::SmallVectorImpl<std::__cxx11::string>::insert<llvm::StringRef_const*,void>
                ((SmallVectorImpl<std::__cxx11::string> *)&this->depsPaths,
                 (iterator)
                 (this->depsPaths).
                 super_SmallVectorImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .
                 super_SmallVectorTemplateBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 .
                 super_SmallVectorTemplateCommon<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                 .super_SmallVectorBase.BeginX,From,From + __n);
    }
    return true;
  }
LAB_001aed92:
  bVar4 = ExternalCommand::configureAttribute(&this->super_ExternalCommand,ctx,name,values);
  return bVar4;
}

Assistant:

bool ShellCommand::configureAttribute(const ConfigureContext& ctx, StringRef name,
                                              ArrayRef<StringRef> values) {
  if (name == "args") {
    // Diagnose missing arguments.
    if (values.empty()) {
      ctx.error("invalid arguments for command '" + getName() + "'");
      return false;
    }

    args.clear();
    args.reserve(values.size());
    for (auto arg: values) {
      args.emplace_back(ctx.getDelegate().getInternedString(arg));
    }
  } else if (name == "deps") {
    depsPaths.clear();
    depsPaths.insert(depsPaths.begin(), values.begin(), values.end());
  } else {
    return ExternalCommand::configureAttribute(ctx, name, values);
  }

  return true;
}